

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcSimulationDataGenerator::GenControlField
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcSimulationDataGenerator *this,HdlcFrameType frameType,HdlcControlType controlType,
          U8 value)

{
  byte *__args;
  iterator iVar1;
  pointer *ppuVar2;
  U8 ctrl;
  byte local_1a;
  byte local_19;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (frameType == HDLC_U_FRAME) {
    local_1a = value | 3;
  }
  else if (frameType == HDLC_S_FRAME) {
    local_1a = (value & 0xfc) + 1;
  }
  else {
    if (frameType != HDLC_I_FRAME) {
      return __return_storage_ptr__;
    }
    local_1a = value & 0xfe;
  }
  local_19 = local_1a;
  if (HDLC_S_FRAME < frameType) {
    if (frameType != HDLC_U_FRAME) {
      return __return_storage_ptr__;
    }
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      __args = &local_19;
      local_1a = value;
      goto LAB_0010d828;
    }
    goto LAB_0010d81c;
  }
  ppuVar2 = &(__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  iVar1._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_1a = value;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar1,
               &local_19);
  }
  else {
    *iVar1._M_current = local_1a;
    *ppuVar2 = *ppuVar2 + 1;
    local_1a = value;
  }
  if (controlType != HDLC_EXTENDED_CONTROL_FIELD_MOD_128) {
    if (controlType == HDLC_EXTENDED_CONTROL_FIELD_MOD_32768) {
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar1,&local_1a);
      }
      else {
        *iVar1._M_current = local_1a;
        *ppuVar2 = *ppuVar2 + 1;
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current !=
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010d7f6;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar1
                 ,&local_1a);
    }
    else {
      if (controlType != HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648) {
        return __return_storage_ptr__;
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar1,&local_1a);
      }
      else {
        *iVar1._M_current = local_1a;
        *ppuVar2 = *ppuVar2 + 1;
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar1,&local_1a);
      }
      else {
        *iVar1._M_current = local_1a;
        *ppuVar2 = *ppuVar2 + 1;
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar1,&local_1a);
      }
      else {
        *iVar1._M_current = local_1a;
        *ppuVar2 = *ppuVar2 + 1;
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar1,&local_1a);
      }
      else {
        *iVar1._M_current = local_1a;
        *ppuVar2 = *ppuVar2 + 1;
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar1,&local_1a);
      }
      else {
        *iVar1._M_current = local_1a;
        *ppuVar2 = *ppuVar2 + 1;
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar1,&local_1a);
      }
      else {
LAB_0010d7f6:
        *iVar1._M_current = local_1a;
        *ppuVar2 = *ppuVar2 + 1;
      }
    }
  }
  iVar1._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    __args = &local_1a;
LAB_0010d828:
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar1,
               __args);
    return __return_storage_ptr__;
  }
LAB_0010d81c:
  ppuVar2 = &(__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *iVar1._M_current = local_1a;
  *ppuVar2 = *ppuVar2 + 1;
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::GenControlField( HdlcFrameType frameType, HdlcControlType controlType, U8 value ) const
{
    vector<U8> controlRet;
    U8 ctrl;
    switch( frameType )
    {
    case HDLC_I_FRAME:
        ctrl = ( value & 0xFE ) | U8( frameType );
        break;
    case HDLC_S_FRAME:
        ctrl = ( value & 0xFC ) | U8( frameType );
        break;
    case HDLC_U_FRAME:
        ctrl = value | U8( HDLC_U_FRAME );
    }

    switch( frameType )
    {
    case HDLC_I_FRAME:
    case HDLC_S_FRAME:
    {
        // first byte
        controlRet.push_back( ctrl );
        switch( controlType )
        {
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
            controlRet.push_back( value ); // second byte
            break;
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
            controlRet.push_back( value ); // second byte
            controlRet.push_back( value ); // third byte
            controlRet.push_back( value ); // fourth byte
            break;
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
            controlRet.push_back( value ); // second byte
            controlRet.push_back( value ); // third byte
            controlRet.push_back( value ); // fourth byte
            controlRet.push_back( value ); // fifth byte
            controlRet.push_back( value ); // sixth byte
            controlRet.push_back( value ); // seventh byte
            controlRet.push_back( value ); // eighth byte
            break;
        }
        break;
    }
    case HDLC_U_FRAME: // U frames are always of 8 bits
    {
        controlRet.push_back( ctrl );
        break;
    }
    }
    return controlRet;
}